

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

point3 * __thiscall camera::defocus_disk_sample(point3 *__return_storage_ptr__,camera *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  do {
    iVar7 = rand();
    dVar9 = (double)iVar7 * 4.656612873077393e-10 + (double)iVar7 * 4.656612873077393e-10 + -1.0;
    iVar7 = rand();
    dVar8 = (double)iVar7 * 4.656612873077393e-10 + (double)iVar7 * 4.656612873077393e-10 + -1.0;
  } while (1.0 <= dVar9 * dVar9 + dVar8 * dVar8);
  dVar1 = (this->defocus_disk_u).e[1];
  dVar2 = (this->defocus_disk_u).e[2];
  dVar3 = (this->center).e[1];
  dVar4 = (this->center).e[2];
  dVar5 = (this->defocus_disk_v).e[1];
  dVar6 = (this->defocus_disk_v).e[2];
  __return_storage_ptr__->e[0] =
       (this->defocus_disk_v).e[0] * dVar8 +
       (this->defocus_disk_u).e[0] * dVar9 + (this->center).e[0];
  __return_storage_ptr__->e[1] = dVar5 * dVar8 + dVar1 * dVar9 + dVar3;
  __return_storage_ptr__->e[2] = dVar8 * dVar6 + dVar9 * dVar2 + dVar4;
  return __return_storage_ptr__;
}

Assistant:

point3 defocus_disk_sample() const {
        // Returns a random point in the camera defocus disk.
        auto p = random_in_unit_disk();
        return center + (p[0] * defocus_disk_u) + (p[1] * defocus_disk_v);
    }